

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_att.cc
# Opt level: O2

int X509_ATTRIBUTE_set1_data(X509_ATTRIBUTE *attr,int attrtype,void *data,int len)

{
  int iVar1;
  ASN1_TYPE *a;
  ASN1_STRING *str;
  size_t sVar2;
  
  if (attr == (X509_ATTRIBUTE *)0x0) {
    return 0;
  }
  if (attrtype == 0) {
    return 1;
  }
  a = ASN1_TYPE_new();
  if (a == (ASN1_TYPE *)0x0) {
    return 0;
  }
  if (((uint)attrtype >> 0xc & 1) == 0) {
    if (len != -1) {
      str = ASN1_STRING_type_new(attrtype);
      if ((str == (ASN1_STRING *)0x0) || (iVar1 = ASN1_STRING_set(str,data,len), iVar1 == 0)) {
        ASN1_STRING_free(str);
        goto LAB_00415f3a;
      }
      goto LAB_00415ef0;
    }
    iVar1 = ASN1_TYPE_set1(a,attrtype,data);
    if (iVar1 == 0) goto LAB_00415f3a;
  }
  else {
    iVar1 = OBJ_obj2nid(attr->object);
    str = ASN1_STRING_set_by_NID((ASN1_STRING **)0x0,(uchar *)data,len,attrtype,iVar1);
    if (str == (ASN1_STRING *)0x0) {
      ERR_put_error(0xb,0,0xc,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_att.cc"
                    ,0x7a);
      goto LAB_00415f3a;
    }
LAB_00415ef0:
    asn1_type_set0_string((ASN1_TYPE *)a,(ASN1_STRING *)str);
  }
  sVar2 = OPENSSL_sk_push(*(OPENSSL_STACK **)&attr->single,a);
  if (sVar2 != 0) {
    return 1;
  }
LAB_00415f3a:
  ASN1_TYPE_free(a);
  return 0;
}

Assistant:

int X509_ATTRIBUTE_set1_data(X509_ATTRIBUTE *attr, int attrtype,
                             const void *data, int len) {
  if (!attr) {
    return 0;
  }

  if (attrtype == 0) {
    // Do nothing. This is used to create an empty value set in
    // |X509_ATTRIBUTE_create_by_*|. This is invalid, but supported by OpenSSL.
    return 1;
  }

  ASN1_TYPE *typ = ASN1_TYPE_new();
  if (typ == NULL) {
    return 0;
  }

  // This function is several functions in one.
  if (attrtype & MBSTRING_FLAG) {
    // |data| is an encoded string. We must decode and re-encode it to |attr|'s
    // preferred ASN.1 type. Note |len| may be -1, in which case
    // |ASN1_STRING_set_by_NID| calls |strlen| automatically.
    ASN1_STRING *str =
        ASN1_STRING_set_by_NID(NULL, reinterpret_cast<const uint8_t *>(data),
                               len, attrtype, OBJ_obj2nid(attr->object));
    if (str == NULL) {
      OPENSSL_PUT_ERROR(X509, ERR_R_ASN1_LIB);
      goto err;
    }
    asn1_type_set0_string(typ, str);
  } else if (len != -1) {
    // |attrtype| must be a valid |ASN1_STRING| type. |data| and |len| is a
    // value in the corresponding |ASN1_STRING| representation.
    ASN1_STRING *str = ASN1_STRING_type_new(attrtype);
    if (str == NULL || !ASN1_STRING_set(str, data, len)) {
      ASN1_STRING_free(str);
      goto err;
    }
    asn1_type_set0_string(typ, str);
  } else {
    // |attrtype| must be a valid |ASN1_TYPE| type. |data| is a pointer to an
    // object of the corresponding type.
    if (!ASN1_TYPE_set1(typ, attrtype, data)) {
      goto err;
    }
  }

  if (!sk_ASN1_TYPE_push(attr->set, typ)) {
    goto err;
  }
  return 1;

err:
  ASN1_TYPE_free(typ);
  return 0;
}